

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Monomorphize.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_224::Monomorphize::Monomorphize(Monomorphize *this,bool onlyWhenHelpful)

{
  (this->super_Pass).runner = (PassRunner *)0x0;
  (this->super_Pass).name._M_dataplus._M_p = (pointer)&(this->super_Pass).name.field_2;
  (this->super_Pass).name._M_string_length = 0;
  (this->super_Pass).name.field_2._M_local_buf[0] = '\0';
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__Monomorphize_00e1f8e0;
  this->onlyWhenHelpful = onlyWhenHelpful;
  (this->funcParamMap)._M_h._M_buckets = &(this->funcParamMap)._M_h._M_single_bucket;
  (this->funcParamMap)._M_h._M_bucket_count = 1;
  (this->funcParamMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->funcParamMap)._M_h._M_element_count = 0;
  (this->funcParamMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->funcParamMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->funcParamMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

Monomorphize(bool onlyWhenHelpful) : onlyWhenHelpful(onlyWhenHelpful) {}